

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O3

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  int iVar1;
  uint uVar2;
  permInfo *pi;
  Abc_TtMan_t *p_00;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char pCanonPerm [16];
  timespec ts_1;
  uint pAux [2048];
  word pAuxWord1 [1024];
  char local_4058 [16];
  timespec local_4048;
  timespec local_4038 [512];
  word local_2038 [1025];
  
  iVar1 = clock_gettime(3,local_4038);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_4038[0].tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_4038[0].tv_sec * -1000000;
  }
  if (NpnType == 0) {
    pcVar5 = "uniqifying         ";
LAB_00282c64:
    if (0x10 < p->nVars) {
LAB_00283215:
      __assert_fail("p->nVars <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                    ,0xcc,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    pcVar3 = "s";
    if (p->nFuncs == 1) {
      pcVar3 = "";
    }
    printf("Applying %-20s to %8d func%s of %2d vars...  ",pcVar5,(ulong)(uint)p->nFuncs,pcVar3);
  }
  else {
    if ((uint)NpnType < 8) {
      pcVar5 = &DAT_0087dd9c + *(int *)(&DAT_0087dd98 + (long)NpnType * 4);
      goto LAB_00282c64;
    }
    if (0x10 < p->nVars) goto LAB_00283215;
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  if (NpnType == 0) {
    iVar1 = p->nFuncs;
    uVar2 = 0xffffffff;
    if (iVar1 < 1) goto LAB_00283166;
    uVar7 = 0;
    do {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        putchar(10);
        iVar1 = p->nFuncs;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)iVar1);
    goto LAB_002830d1;
  }
  switch(NpnType) {
  case 1:
    Abc_TruthNpnCountUnique(p);
    pi = setPermInfoPtr(p->nVars);
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose == 0) {
          simpleMinimal(p->pFuncs[uVar7],(word *)local_4038,local_2038,pi,p->nVars);
        }
        else {
          printf("%7d : ",uVar7 & 0xffffffff);
          simpleMinimal(p->pFuncs[uVar7],(word *)local_4038,local_2038,pi,p->nVars);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
          Abc_TruthNpnPrint(local_4058,0,p->nVars);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    freePermInfoPtr(pi);
    uVar2 = 0xffffffff;
    goto LAB_00283166;
  case 2:
    uVar2 = 0xffffffff;
    if (p->nFuncs < 1) goto LAB_00283166;
    uVar7 = 0;
    do {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      resetPCanonPermArray(local_4058,p->nVars);
      uVar2 = Kit_TruthSemiCanonicize
                        ((uint *)p->pFuncs[uVar7],(uint *)local_4038,p->nVars,local_4058);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(local_4058,uVar2,p->nVars);
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)p->nFuncs);
    break;
  case 3:
    uVar2 = 0xffffffff;
    if (p->nFuncs < 1) goto LAB_00283166;
    uVar7 = 0;
    do {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      resetPCanonPermArray(local_4058,p->nVars);
      uVar2 = luckyCanonicizer_final_fast(p->pFuncs[uVar7],p->nVars,local_4058);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(local_4058,uVar2,p->nVars);
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)p->nFuncs);
    break;
  case 4:
    uVar2 = 0xffffffff;
    if (p->nFuncs < 1) goto LAB_00283166;
    uVar7 = 0;
    do {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      resetPCanonPermArray(local_4058,p->nVars);
      uVar2 = luckyCanonicizer_final_fast1(p->pFuncs[uVar7],p->nVars,local_4058);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(local_4058,uVar2,p->nVars);
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)p->nFuncs);
    break;
  case 5:
    uVar2 = 0xffffffff;
    if (p->nFuncs < 1) goto LAB_00283166;
    uVar7 = 0;
    do {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      uVar2 = Abc_TtCanonicize(p->pFuncs[uVar7],p->nVars,local_4058);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint(local_4058,uVar2,p->nVars);
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)p->nFuncs);
    break;
  case 6:
    uVar2 = 0xffffffff;
    if (p->nFuncs < 1) goto LAB_00283166;
    uVar7 = 0;
    do {
      if (fVerbose != 0) {
        printf("%7d : ",uVar7 & 0xffffffff);
      }
      uVar2 = Abc_TtCanonicizePhase(p->pFuncs[uVar7],p->nVars);
      if (fVerbose != 0) {
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar7],p->nVars);
        Abc_TruthNpnPrint((char *)0x0,uVar2,p->nVars);
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)p->nFuncs);
    break;
  case 7:
    p_00 = Abc_TtManStart(p->nVars);
    if (0 < p->nFuncs) {
      uVar7 = 0;
      do {
        if (fVerbose == 0) {
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar7],p->nVars,local_4058);
        }
        else {
          printf("%7d : ",uVar7 & 0xffffffff);
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar7],p->nVars,local_4058);
          putchar(10);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nFuncs);
    }
    uVar2 = Abc_TtManNumClasses(p_00);
    Abc_TtManStop(p_00);
    goto LAB_00283166;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                  ,0x13a,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
  }
LAB_002830d1:
  uVar2 = 0xffffffff;
LAB_00283166:
  iVar1 = clock_gettime(3,&local_4048);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_4048.tv_nsec / 1000 + local_4048.tv_sec * 1000000;
  }
  if (uVar2 == 0xffffffff) {
    uVar2 = Abc_TruthNpnCountUnique(p);
  }
  iVar1 = 0x87dfe8;
  printf("Classes =%9d  ",(ulong)uVar2);
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i, nClasses = -1;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying         ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN          ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s        ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast    ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        extern unsigned Abc_TtCanonicizeHie( Abc_TtMan_t * p, word * pTruth, int nVars, char * pCanonPerm );
        extern Abc_TtMan_t * Abc_TtManStart( int nVars );
        extern void Abc_TtManStop( Abc_TtMan_t * p );
        extern int Abc_TtManNumClasses( Abc_TtMan_t * p );

        Abc_TtMan_t * pMan = Abc_TtManStart( p->nVars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        nClasses = Abc_TtManNumClasses( pMan );
        Abc_TtManStop( pMan );
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", nClasses == -1 ? Abc_TruthNpnCountUnique(p) : nClasses );
    Abc_PrintTime( 1, "Time", clk );
}